

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O0

bool __thiscall CLIntercept::checkRelaxAllocationLimitsSupport(CLIntercept *this,cl_program program)

{
  byte bVar1;
  cl_int cVar2;
  CLIntercept *in_RSI;
  cl_device_id *deviceList;
  cl_uint numDevices;
  bool supported;
  cl_int errorCode;
  undefined1 local_39;
  void *pvVar3;
  uint in_stack_ffffffffffffffe0;
  undefined4 uVar4;
  undefined3 in_stack_ffffffffffffffe8;
  uint uVar5;
  
  uVar5 = CONCAT13(1,in_stack_ffffffffffffffe8);
  uVar4 = 0;
  pvVar3 = (void *)0x0;
  cVar2 = allocateAndGetProgramDeviceList
                    (in_RSI,(cl_program)(ulong)uVar5,(cl_uint *)(ulong)in_stack_ffffffffffffffe0,
                     (cl_device_id **)0x0);
  bVar1 = (byte)(uVar5 >> 0x18);
  if (cVar2 == 0) {
    bVar1 = checkRelaxAllocationLimitsSupport
                      (in_RSI,0,(cl_device_id *)CONCAT44(uVar4,in_stack_ffffffffffffffe0));
  }
  if (pvVar3 != (void *)0x0) {
    operator_delete__(pvVar3);
  }
  local_39 = 0;
  if (cVar2 == 0) {
    local_39 = bVar1;
  }
  return (bool)(local_39 & 1);
}

Assistant:

bool CLIntercept::checkRelaxAllocationLimitsSupport(
    cl_program program ) const
{
    cl_int  errorCode = CL_SUCCESS;
    bool    supported = true;

    cl_uint         numDevices = 0;
    cl_device_id*   deviceList = NULL;
    if( errorCode == CL_SUCCESS )
    {
        errorCode = allocateAndGetProgramDeviceList(
            program,
            numDevices,
            deviceList );
    }

    if( errorCode == CL_SUCCESS )
    {
        supported = checkRelaxAllocationLimitsSupport(
            numDevices,
            deviceList );
    }

    delete [] deviceList;

    return ( errorCode == CL_SUCCESS ) && supported;
}